

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

void free_buf(BUFFER *buffer)

{
  if ((buffer != (BUFFER *)0x0) && (buffer->valid == true)) {
    if (buffer->string != (char *)0x0) {
      free_pstring(buffer->string);
    }
    buffer->string = (char *)0x0;
    buffer->state = 2;
    buffer->size = 0;
    buffer->valid = false;
    buffer->next = buf_free;
    buf_free = buffer;
  }
  return;
}

Assistant:

void free_buf(BUFFER *buffer)
{
	if (!(buffer != nullptr && buffer->valid))
		return;

	if (buffer->string)
		free_pstring(buffer->string);

	buffer->string = nullptr;
	buffer->size = 0;
	buffer->state = BUFFER_FREED;

	buffer->valid = false;
	buffer->next = buf_free;
	buf_free = buffer;
}